

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageFieldGenerator::GenerateExtensionCode
          (MessageFieldGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  Options *options;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  MessageFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  options = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  WritePropertyDocComment(printer,options,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddDeprecatedFlag(&this->super_FieldGeneratorBase,local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "$access_level$ static readonly pb::Extension<$extended_type$, $type_name$> $property_name$ =\n  new pb::Extension<$extended_type$, $type_name$>($number$, "
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&(this->super_FieldGeneratorBase).variables_,local_28);
  (*(this->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase[4])
            (this,local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,");\n");
  protobuf::io::Printer::Print<>(pPVar1,local_38);
  return;
}

Assistant:

void MessageFieldGenerator::GenerateExtensionCode(io::Printer* printer) {
  WritePropertyDocComment(printer, options(), descriptor_);
  AddDeprecatedFlag(printer);
  printer->Print(
    variables_,
    "$access_level$ static readonly pb::Extension<$extended_type$, $type_name$> $property_name$ =\n"
    "  new pb::Extension<$extended_type$, $type_name$>($number$, ");
  GenerateCodecCode(printer);
  printer->Print(");\n");
}